

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriConnectivity.cc
# Opt level: O0

HalfedgeHandle __thiscall
OpenMesh::TriConnectivity::insert_loop(TriConnectivity *this,HalfedgeHandle _hh)

{
  bool bVar1;
  HalfedgeHandle HVar2;
  VertexHandle _end_vh;
  VertexHandle _start_vh;
  BaseHandle _heh;
  FaceHandle _fh;
  HalfedgeHandle HVar3;
  FaceHandle f1;
  FaceHandle f0;
  HalfedgeHandle o1;
  VertexHandle v1;
  VertexHandle v0;
  HalfedgeHandle o0;
  HalfedgeHandle h0;
  TriConnectivity *this_local;
  HalfedgeHandle _hh_local;
  HalfedgeHandle h1;
  
  HVar2 = ArrayKernel::opposite_halfedge_handle((ArrayKernel *)this,_hh);
  _end_vh = ArrayKernel::to_vertex_handle((ArrayKernel *)this,HVar2);
  _start_vh = ArrayKernel::to_vertex_handle((ArrayKernel *)this,_hh);
  _heh.idx_ = (int)ArrayKernel::new_edge((ArrayKernel *)this,_start_vh,_end_vh);
  HVar2 = ArrayKernel::opposite_halfedge_handle((ArrayKernel *)this,(HalfedgeHandle)_heh.idx_);
  f1 = ArrayKernel::face_handle((ArrayKernel *)this,_hh);
  _fh = ArrayKernel::new_face((ArrayKernel *)this);
  HVar3 = ArrayKernel::prev_halfedge_handle((ArrayKernel *)this,_hh);
  ArrayKernel::set_next_halfedge_handle((ArrayKernel *)this,HVar3,HVar2);
  HVar3 = ArrayKernel::next_halfedge_handle((ArrayKernel *)this,_hh);
  ArrayKernel::set_next_halfedge_handle((ArrayKernel *)this,HVar2,HVar3);
  ArrayKernel::set_next_halfedge_handle((ArrayKernel *)this,(HalfedgeHandle)_heh.idx_,_hh);
  ArrayKernel::set_next_halfedge_handle((ArrayKernel *)this,_hh,(HalfedgeHandle)_heh.idx_);
  ArrayKernel::set_face_handle((ArrayKernel *)this,HVar2,f1);
  ArrayKernel::set_face_handle((ArrayKernel *)this,_hh,_fh);
  ArrayKernel::set_face_handle((ArrayKernel *)this,(HalfedgeHandle)_heh.idx_,_fh);
  ArrayKernel::set_halfedge_handle((ArrayKernel *)this,_fh,_hh);
  bVar1 = BaseHandle::is_valid(&f1.super_BaseHandle);
  if (bVar1) {
    ArrayKernel::set_halfedge_handle((ArrayKernel *)this,f1,HVar2);
  }
  PolyConnectivity::adjust_outgoing_halfedge(&this->super_PolyConnectivity,_end_vh);
  PolyConnectivity::adjust_outgoing_halfedge(&this->super_PolyConnectivity,_start_vh);
  return (BaseHandle)(BaseHandle)_heh.idx_;
}

Assistant:

TriConnectivity::HalfedgeHandle
TriConnectivity::insert_loop(HalfedgeHandle _hh)
{
  HalfedgeHandle  h0(_hh);
  HalfedgeHandle  o0(opposite_halfedge_handle(h0));

  VertexHandle    v0(to_vertex_handle(o0));
  VertexHandle    v1(to_vertex_handle(h0));

  HalfedgeHandle  h1 = new_edge(v1, v0);
  HalfedgeHandle  o1 = opposite_halfedge_handle(h1);

  FaceHandle      f0 = face_handle(h0);
  FaceHandle      f1 = new_face();

  // halfedge -> halfedge
  set_next_halfedge_handle(prev_halfedge_handle(h0), o1);
  set_next_halfedge_handle(o1, next_halfedge_handle(h0));
  set_next_halfedge_handle(h1, h0);
  set_next_halfedge_handle(h0, h1);

  // halfedge -> face
  set_face_handle(o1, f0);
  set_face_handle(h0, f1);
  set_face_handle(h1, f1);

  // face -> halfedge
  set_halfedge_handle(f1, h0);
  if (f0.is_valid())
    set_halfedge_handle(f0, o1);


  // vertex -> halfedge
  adjust_outgoing_halfedge(v0);
  adjust_outgoing_halfedge(v1);

  return h1;
}